

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

State csv::parse(IDataSource *parser,FieldCallback *emitField,RecordCallback *emitRecord)

{
  pointer pcVar1;
  pointer pfVar2;
  bool bVar3;
  int iVar4;
  field *field_1;
  pointer pfVar5;
  undefined8 uVar6;
  _func_int **pp_Var7;
  State SVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pfVar11;
  byte bVar12;
  size_t sVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  record record;
  field field;
  record local_d8;
  undefined1 local_b8 [16];
  _Alloc_hider local_a8;
  char *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Any_data *local_88;
  size_t local_80;
  FieldCallback *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  parser->cancelled = false;
  local_78 = emitField;
  iVar4 = (*parser->_vptr_IDataSource[2])();
  SVar8 = Complete;
  if ((char)iVar4 != '\0') {
    local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d8.row = 0;
    local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_80 = 0;
    local_88 = (_Any_data *)emitRecord;
    do {
      pfVar2 = local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pfVar5 = local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
          super__Vector_impl_data._M_start) {
        paVar10 = &((local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                     _M_impl.super__Vector_impl_data._M_start)->content).field_2;
        do {
          pcVar1 = (((string *)(paVar10 + -1))->_M_dataplus)._M_p;
          if (paVar10 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1) {
            operator_delete(pcVar1);
          }
          pfVar11 = (pointer)(paVar10 + 1);
          paVar10 = paVar10 + 3;
        } while (pfVar11 != pfVar2);
        local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
        super__Vector_impl_data._M_finish = pfVar5;
      }
      local_d8.row = local_80;
      std::function<bool_(const_csv::field_&)>::function
                ((function<bool_(const_csv::field_&)> *)&local_70,local_78);
      local_b8._0_8_ = 0;
      local_b8._8_8_ = 0;
      local_a8._M_p = (pointer)&local_98;
      local_a0 = (char *)0x0;
      local_98._M_local_buf[0] = '\0';
      if (parser->cancelled == false) {
        bVar3 = true;
        sVar13 = 0;
LAB_00115c55:
        (*parser->_vptr_IDataSource[9])(parser);
        if ((!bVar3) || (iVar4 = (*parser->_vptr_IDataSource[4])(parser), (char)iVar4 == '\0')) {
          if (parser->trimLeadingWhitespace == true) {
            do {
              iVar4 = (*parser->_vptr_IDataSource[6])(parser);
              if ((char)iVar4 == '\0') break;
              iVar4 = (*parser->_vptr_IDataSource[2])(parser);
            } while ((char)iVar4 != '\0');
          }
          iVar4 = (*parser->_vptr_IDataSource[8])(parser);
          uVar9 = 1;
          if ((char)iVar4 != '\0') goto LAB_00115e13;
          iVar4 = (*parser->_vptr_IDataSource[7])(parser);
          if ((char)iVar4 == '\0') {
            do {
              if (parser->cancelled != false) goto LAB_00115e0e;
              iVar4 = (*parser->_vptr_IDataSource[5])(parser);
              if ((char)iVar4 != '\0') goto LAB_00115ecd;
              iVar4 = (*parser->_vptr_IDataSource[8])(parser);
              if ((char)iVar4 != '\0') goto LAB_00115e13;
              iVar4 = (*parser->_vptr_IDataSource[7])(parser);
              pp_Var7 = parser->_vptr_IDataSource;
              if ((char)iVar4 != '\0') {
                iVar4 = (*pp_Var7[2])(parser);
                if ((char)iVar4 == '\0') break;
                iVar4 = (*parser->_vptr_IDataSource[7])(parser);
                pp_Var7 = parser->_vptr_IDataSource;
                if ((char)iVar4 == '\0') {
                  (*pp_Var7[3])(parser);
                  pp_Var7 = parser->_vptr_IDataSource;
                }
              }
              (*pp_Var7[10])(parser);
              iVar4 = (*parser->_vptr_IDataSource[2])(parser);
            } while ((char)iVar4 != '\0');
            goto LAB_00115dc3;
          }
          iVar4 = (*parser->_vptr_IDataSource[2])(parser);
          while ((char)iVar4 != '\0') {
            if (parser->cancelled != false) goto LAB_00115e0e;
            iVar4 = (*parser->_vptr_IDataSource[7])(parser);
            pp_Var7 = parser->_vptr_IDataSource;
            if ((char)iVar4 != '\0') {
              iVar4 = (*pp_Var7[2])(parser);
              if ((char)iVar4 == '\0') break;
              iVar4 = (*parser->_vptr_IDataSource[7])(parser);
              if ((char)iVar4 == '\0') goto LAB_00115dca;
              pp_Var7 = parser->_vptr_IDataSource;
            }
            (*pp_Var7[10])(parser);
            iVar4 = (*parser->_vptr_IDataSource[2])(parser);
          }
          goto LAB_00115e00;
        }
        do {
          iVar4 = (*parser->_vptr_IDataSource[8])(parser);
          if ((char)iVar4 != '\0') {
            uVar9 = 1;
            goto LAB_00115e13;
          }
          iVar4 = (*parser->_vptr_IDataSource[2])(parser);
        } while ((char)iVar4 != '\0');
LAB_00115dc3:
        uVar9 = 2;
        goto LAB_00115e13;
      }
LAB_00115c45:
      uVar9 = 3;
LAB_00115f21:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &local_98) {
        operator_delete(local_a8._M_p);
      }
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      pfVar5 = local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (parser->skipBlankLines != true) {
LAB_00115f72:
        local_80 = local_80 + 1;
        if (*(_Manager_type *)(local_88 + 1) == (_Manager_type)0x0) goto LAB_00115fac;
        (*parser->_vptr_IDataSource[0xc])(parser);
        local_b8._0_8_ = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        if (*(long *)(local_88 + 1) == 0) {
          uVar6 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_p != &local_98) {
            operator_delete(local_a8._M_p);
          }
          if (local_60 != (code *)0x0) {
            (*local_60)(&local_70,&local_70,__destroy_functor);
          }
          std::vector<csv::field,_std::allocator<csv::field>_>::~vector(&local_d8.content);
          _Unwind_Resume(uVar6);
        }
        bVar3 = (**(code **)((long)local_88 + 0x18))(local_88,&local_d8,(double *)local_b8);
        if (bVar3) goto LAB_00115fac;
LAB_00115fcd:
        SVar8 = Complete;
        goto LAB_00115fcf;
      }
      for (; pfVar5 != local_d8.content.super__Vector_base<csv::field,_std::allocator<csv::field>_>.
                       _M_impl.super__Vector_impl_data._M_finish; pfVar5 = pfVar5 + 1) {
        if ((pfVar5->content)._M_string_length != 0) goto LAB_00115f72;
      }
LAB_00115fac:
      iVar4 = (*parser->_vptr_IDataSource[2])(parser);
      if ((char)iVar4 == '\0') goto LAB_00115fcd;
    } while (uVar9 < 2);
    SVar8 = (State)(uVar9 == 3);
LAB_00115fcf:
    std::vector<csv::field,_std::allocator<csv::field>_>::~vector(&local_d8.content);
  }
  return SVar8;
LAB_00115e0e:
  uVar9 = 3;
LAB_00115e13:
  bVar12 = 0;
LAB_00115e16:
  if (parser->cancelled != false) goto LAB_00115c45;
  (*parser->_vptr_IDataSource[0xb])((string *)local_50,parser);
  std::__cxx11::string::operator=((string *)&local_a8,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_b8._0_8_ = local_d8.row;
  local_b8._8_8_ = sVar13;
  std::vector<csv::field,_std::allocator<csv::field>_>::push_back
            (&local_d8.content,(value_type *)local_b8);
  if (local_60 == (code *)0x0) {
    if (bVar12 == 0) goto LAB_00115f21;
  }
  else {
    bVar3 = (*local_58)(&local_70,(value_type *)local_b8);
    if ((bVar12 & bVar3) == 0) {
      if (!bVar3) {
        uVar9 = 2;
      }
      goto LAB_00115f21;
    }
  }
  iVar4 = (*parser->_vptr_IDataSource[5])(parser);
  if (((char)iVar4 == '\0') ||
     (iVar4 = (*parser->_vptr_IDataSource[2])(parser), (char)iVar4 == '\0')) {
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,local_a0,0x1170ac);
    local_b8._8_8_ = sVar13 + 1;
    local_b8._0_8_ = local_d8.row;
    uVar9 = 2;
    std::vector<csv::field,_std::allocator<csv::field>_>::push_back
              (&local_d8.content,(value_type *)local_b8);
    goto LAB_00115f21;
  }
  sVar13 = sVar13 + 1;
  bVar3 = false;
  if (parser->cancelled != false) goto LAB_00115c45;
  goto LAB_00115c55;
  while( true ) {
    iVar4 = (*parser->_vptr_IDataSource[5])(parser);
    if ((char)iVar4 != '\0') goto LAB_00115ecd;
    iVar4 = (*parser->_vptr_IDataSource[2])(parser);
    if ((char)iVar4 == '\0') break;
LAB_00115dca:
    iVar4 = (*parser->_vptr_IDataSource[8])(parser);
    if ((char)iVar4 != '\0') goto LAB_00115e13;
  }
LAB_00115e00:
  bVar12 = 0;
  uVar9 = 2;
  goto LAB_00115e16;
LAB_00115ecd:
  uVar9 = 0;
  bVar12 = 1;
  goto LAB_00115e16;
}

Assistant:

State parse(IDataSource& parser, FieldCallback emitField, RecordCallback emitRecord) {
		//  file = [header CRLF] record *(CRLF record) [CRLF]

		InternalState state = InternalState::EndOfFile;
		parser.cancelled = false;

		// Move to the first character
		if (!parser.next()) {
			// File is empty.  Do nothing
			return State::Complete;
		}

		csv::record record;

		size_t row = 0;
		do {
			record.content.clear();
			record.row = row;

			state = parseRecord(parser, record, emitField);

			if (!parser.skipBlankLines || !record.empty()) {
				row++;
				if (emitRecord && (emitRecord(record, parser.progress()) == false)) {
					return State::Complete;
				}
			}

			if (!parser.next()) {
				return State::Complete;
			}
		}
		while (state != InternalState::Canceled && state != InternalState::EndOfFile);

		switch (state) {
			case InternalState::Canceled:
				return State::Cancelled;
			case InternalState::EndOfFile:
				return State::Complete;
			default:
				assert(false);
				return State::Error;
		}
	}